

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_find_target(ly_path *path,lyd_node *tree,lyd_node **match)

{
  LY_ERR LVar1;
  lyd_node *in_RAX;
  lyd_node *m;
  lyd_node *local_18;
  
  if (path == (ly_path *)0x0) {
    LVar1 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","path","lyd_find_target");
  }
  else {
    local_18 = in_RAX;
    LVar1 = ly_path_eval(path,tree,(lyxp_var *)0x0,&local_18);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = LY_SUCCESS;
      if (match != (lyd_node **)0x0) {
        *match = local_18;
        LVar1 = LY_SUCCESS;
      }
    }
    else {
      LVar1 = LY_ENOTFOUND;
      if (match != (lyd_node **)0x0) {
        *match = (lyd_node *)0x0;
      }
    }
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_target(const struct ly_path *path, const struct lyd_node *tree, struct lyd_node **match)
{
    LY_ERR ret;
    struct lyd_node *m;

    LY_CHECK_ARG_RET(NULL, path, LY_EINVAL);

    ret = ly_path_eval(path, tree, NULL, &m);
    if (ret) {
        if (match) {
            *match = NULL;
        }
        return LY_ENOTFOUND;
    }

    if (match) {
        *match = m;
    }
    return LY_SUCCESS;
}